

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# information_flow.c
# Opt level: O0

double inform_information_flow
                 (int *src,int *dst,int *back,size_t l_src,size_t l_dst,size_t l_back,size_t n,
                 size_t m,int b,inform_error *err)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  ulong uVar5;
  uint32_t *puVar6;
  long lVar7;
  uint32_t *puVar8;
  uint32_t *puVar9;
  void *__ptr;
  int iVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int local_14c;
  int local_148;
  int a_state;
  int b_state;
  int s_state;
  double njoint;
  double nas;
  double nbs;
  double ns;
  int joint_state;
  int as_state;
  int bs_state;
  double flow;
  inform_dist s;
  inform_dist bs;
  inform_dist as;
  inform_dist joint;
  uint32_t *data;
  size_t total_size;
  size_t bs_size;
  size_t as_size;
  size_t joint_size;
  size_t s_size;
  size_t b_size;
  size_t a_size;
  size_t N;
  size_t l_back_local;
  size_t l_dst_local;
  size_t l_src_local;
  int *back_local;
  int *dst_local;
  int *src_local;
  
  _Var1 = check_arguments(src,dst,back,l_src,l_dst,l_back,n,m,b,err);
  if (_Var1) {
    src_local = (int *)0x7ff8000000000000;
  }
  else if ((back == (int *)0x0) || (l_back == 0)) {
    src_local = (int *)mutual_info(src,dst,l_src,l_dst,n,m,b,err);
  }
  else {
    sVar3 = n * m;
    auVar15._8_4_ = (int)(l_src >> 0x20);
    auVar15._0_8_ = l_src;
    auVar15._12_4_ = 0x45300000;
    dVar11 = pow((double)b,
                 (auVar15._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)l_src) - 4503599627370496.0));
    uVar4 = (long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f;
    auVar16._8_4_ = (int)(l_dst >> 0x20);
    auVar16._0_8_ = l_dst;
    auVar16._12_4_ = 0x45300000;
    dVar11 = pow((double)b,
                 (auVar16._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)l_dst) - 4503599627370496.0));
    uVar5 = (long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f;
    auVar17._8_4_ = (int)(l_back >> 0x20);
    auVar17._0_8_ = l_back;
    auVar17._12_4_ = 0x45300000;
    dVar11 = pow((double)b,
                 (auVar17._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)l_back) - 4503599627370496.0));
    puVar6 = (uint32_t *)
             ((long)dVar11 | (long)(dVar11 - 9.223372036854776e+18) & (long)dVar11 >> 0x3f);
    lVar7 = uVar4 * uVar5 * (long)puVar6;
    puVar8 = (uint32_t *)(uVar4 * (long)puVar6);
    puVar9 = (uint32_t *)(uVar5 * (long)puVar6);
    __ptr = calloc((long)((long)(lVar7 + (long)puVar8) + (long)puVar9) + (long)puVar6,4);
    if (__ptr == (void *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      src_local = (int *)0x7ff8000000000000;
    }
    else {
      bs.counts = (long)__ptr + lVar7 * 4;
      s.counts = (long)__ptr + (long)puVar8 * 4 + lVar7 * 4;
      flow = (double)((long)__ptr + (long)puVar9 * 4 + (long)puVar8 * 4 + lVar7 * 4);
      s.histogram = puVar6;
      s.size = sVar3;
      bs.histogram = puVar9;
      bs.size = sVar3;
      as.histogram = puVar8;
      as.size = sVar3;
      as.counts = (uint64_t)__ptr;
      accumulate_observations
                (src,dst,back,l_src,l_dst,l_back,n,m,b,(inform_dist *)&as.counts,
                 (inform_dist *)&bs.counts,(inform_dist *)&s.counts,(inform_dist *)&flow);
      _as_state = 0.0;
      for (a_state = 0; iVar10 = (int)puVar6, a_state < iVar10; a_state = a_state + 1) {
        dVar11 = (double)*(uint *)((long)flow + (long)a_state * 4);
        if ((dVar11 != 0.0) || (NAN(dVar11))) {
          for (local_148 = 0; local_148 < (int)uVar5; local_148 = local_148 + 1) {
            iVar2 = local_148 * iVar10 + a_state;
            dVar12 = (double)*(uint *)(s.counts + (long)iVar2 * 4);
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              for (local_14c = 0; local_14c < (int)uVar4; local_14c = local_14c + 1) {
                dVar13 = (double)*(uint *)(bs.counts + (long)(local_14c * iVar10 + a_state) * 4);
                if ((dVar13 != 0.0) || (NAN(dVar13))) {
                  total_size._0_4_ = (int)puVar9;
                  dVar14 = (double)*(uint *)(as.counts +
                                            (long)(local_14c * (int)total_size + iVar2) * 4);
                  if ((dVar14 != 0.0) || (NAN(dVar14))) {
                    dVar13 = log2((dVar14 * dVar11) / (dVar13 * dVar12));
                    _as_state = dVar14 * dVar13 + _as_state;
                  }
                }
              }
            }
          }
        }
      }
      free(__ptr);
      auVar18._8_4_ = (int)(sVar3 >> 0x20);
      auVar18._0_8_ = sVar3;
      auVar18._12_4_ = 0x45300000;
      src_local = (int *)(_as_state /
                         ((auVar18._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)sVar3) - 4503599627370496.0)));
    }
  }
  return (double)src_local;
}

Assistant:

double inform_information_flow(int const *src, int const *dst, int const *back,
    size_t l_src, size_t l_dst, size_t l_back, size_t n, size_t m, int b,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l_src, l_dst, l_back, n, m, b, err))
    {
        return NAN;
    }

    if (back == NULL || l_back == 0)
    {
        return mutual_info(src, dst, l_src, l_dst, n, m, b, err);
    }

    size_t const N = n * m;

    size_t const a_size = pow((double) b, (double) l_src);
    size_t const b_size = pow((double) b, (double) l_dst);
    size_t const s_size = pow((double) b, (double) l_back);

    size_t const joint_size = a_size * b_size * s_size;
    size_t const as_size = a_size * s_size;
    size_t const bs_size = b_size * s_size;

    size_t const total_size = joint_size + as_size + bs_size + s_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist joint = { data, joint_size, N };
    inform_dist as    = { data + joint_size, as_size, N };
    inform_dist bs    = { data + joint_size + as_size, bs_size, N };
    inform_dist s     = { data + joint_size + as_size + bs_size, s_size, N };

    accumulate_observations(src, dst, back, l_src, l_dst, l_back, n, m, b,
        &joint, &as, &bs, &s);

    double flow = 0.0;
    int bs_state, as_state, joint_state;
    double ns, nbs, nas, njoint;
    for (int s_state = 0; s_state < (int) s_size; ++s_state)
    {
        ns = s.histogram[s_state];
        if (ns == 0)
        {
            continue;
        }
        for (int b_state = 0; b_state < (int) b_size; ++b_state)
        {
            bs_state = b_state * s_size + s_state;
            nbs = bs.histogram[bs_state];
            if (nbs == 0)
            {
                continue;
            }
            for (int a_state = 0; a_state < (int) a_size; ++a_state)
            {
                as_state = a_state * s_size + s_state;
                nas = as.histogram[as_state];
                if (nas == 0)
                {
                    continue;
                }
                joint_state = a_state * bs_size + bs_state;
                njoint = joint.histogram[joint_state];
                if (njoint == 0)
                {
                    continue;
                }
                flow += njoint * log2((njoint * ns) / (nas * nbs));
            }
        }
    }

    free(data);

    return flow / N;
}